

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O0

int Map_LibraryRead(Map_SuperLib_t *pLib,char *pFileName)

{
  FILE *__stream;
  int Status;
  FILE *pFile;
  char *pFileName_local;
  Map_SuperLib_t *pLib_local;
  
  if (pLib->pGenlib == (Mio_Library_t *)0x0) {
    __stream = fopen(pFileName,"r");
    if (__stream == (FILE *)0x0) {
      printf("Cannot open input file \"%s\".\n",pFileName);
      pLib_local._4_4_ = 0;
    }
    else {
      pLib_local._4_4_ = Map_LibraryReadFile(pLib,(FILE *)__stream);
      fclose(__stream);
    }
    return pLib_local._4_4_;
  }
  __assert_fail("pLib->pGenlib == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperSuper.c"
                ,0x37,"int Map_LibraryRead(Map_SuperLib_t *, char *)");
}

Assistant:

int Map_LibraryRead( Map_SuperLib_t * pLib, char * pFileName )
{
    FILE * pFile;
    int Status;
    // read the beginning of the file
    assert( pLib->pGenlib == NULL );
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return 0;
    }
    Status = Map_LibraryReadFile( pLib, pFile );
    fclose( pFile );
//    Map_LibraryPrintClasses( pLib );
    return Status;
}